

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O1

Stream * rw::ps2::readMipmap(Stream *stream,int32 param_2,void *object,int32 offset,int32 param_5)

{
  int32 iVar1;
  
  iVar1 = Stream::readI32(stream);
  if (*object != 0) {
    *(short *)(*object + 0xc + (long)nativeRasterOffset) = (short)iVar1;
  }
  return stream;
}

Assistant:

static Stream*
readMipmap(Stream *stream, int32, void *object, int32 offset, int32)
{
	uint16 val = stream->readI32();
	Texture *tex = (Texture*)object;
	if(tex->raster == nil)
		return stream;
	Ps2Raster *raster = GETPS2RASTEREXT(tex->raster);
	raster->kl = val;
	return stream;
}